

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O2

bool __thiscall
iutest::floating_point<double>::NanSensitiveAlmostNear
          (floating_point<double> *this,_Myt *rhs,double max_abs_error)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  FInt FStack_10;
  _Myt _Stack_8;
  
  if ((((this->m_v).uv & 0xfffffffffffff) != 0 && (~(this->m_v).uv & 0x7ff0000000000000) == 0) &&
     ((~(rhs->m_v).uv & 0x7ff0000000000000) == 0 && ((rhs->m_v).uv & 0xfffffffffffff) != 0)) {
    return true;
  }
  dVar1 = (this->m_v).fv;
  if (((~(ulong)dVar1 & 0x7ff0000000000000) == 0 && ((ulong)dVar1 & 0xfffffffffffff) != 0) ||
     (dVar2 = (rhs->m_v).fv,
     (~(ulong)dVar2 & 0x7ff0000000000000) == 0 && ((ulong)dVar2 & 0xfffffffffffff) != 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      FStack_10.uv = ~-(ulong)(dVar2 < dVar1) & (ulong)(dVar2 - dVar1) |
                     (ulong)(dVar1 - dVar2) & -(ulong)(dVar2 < dVar1);
      bVar3 = true;
      if (max_abs_error < FStack_10.fv) {
        _Stack_8.m_v = (FInt)max_abs_error;
        bVar3 = AlmostEquals((floating_point<double> *)&FStack_10,&_Stack_8);
      }
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool    NanSensitiveAlmostNear(const _Myt& rhs, RawType max_abs_error) const
    {
        if( is_nan() && rhs.is_nan() )
        {
            return true;
        }
        return AlmostNear(rhs, max_abs_error);
    }